

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS OutputListEnd(JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  JL_STATUS local_20;
  JL_STATUS jlStatus;
  uint32_t StackDepth_local;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlBuffer *JsonBuffer_local;
  
  local_20 = AddNewLineAndIndentation(JsonBuffer,(OutputFlags & 2) != 0,StackDepth);
  if (local_20 == JL_STATUS_SUCCESS) {
    local_20 = JlBufferAdd(JsonBuffer,"]",1);
  }
  return local_20;
}

Assistant:

JL_STATUS
    OutputListEnd
    (
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;

    jlStatus = AddNewLineAndIndentation(
        JsonBuffer,
        OutputFlags & JL_OUTPUT_FLAGS_INDENT ? true : false,
        StackDepth );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        jlStatus = JlBufferAdd( JsonBuffer, "]", 1 );
    }

    return jlStatus;
}